

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffsparser.cpp
# Opt level: O2

USTATUS __thiscall FfsParser::parseRawArea(FfsParser *this,UModelIndex *index)

{
  CBString *this_00;
  vector<PROTECTED_RANGE_,_std::allocator<PROTECTED_RANGE_>_> *this_01;
  TreeModel **this_02;
  TreeModel *pTVar1;
  long *plVar2;
  undefined8 *puVar3;
  undefined8 uVar4;
  uint uVar5;
  bool bVar6;
  UINT8 UVar7;
  byte bVar8;
  UINT32 UVar9;
  uint uVar10;
  UINT32 UVar11;
  int iVar12;
  USTATUS UVar13;
  UINT8 *buffer;
  undefined8 extraout_RAX;
  uint uVar14;
  ulong uVar15;
  long lVar16;
  int i;
  insyde_fdm_t *__return_storage_ptr__;
  int iVar17;
  int32_t pos;
  long *plVar18;
  undefined8 *puVar19;
  UINT8 itemType;
  UINT8 prevItemType;
  FfsParser *local_620;
  UModelIndex *local_618;
  ulong local_610;
  ulong local_608;
  uint local_5fc;
  UModelIndex paddingIndex;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_5d8;
  __uniq_ptr_impl<insyde_fdm_t::fdm_extensions_t,_std::default_delete<insyde_fdm_t::fdm_extensions_t>_>
  local_5c8;
  uint local_5c0;
  UINT32 itemSize;
  uint local_5b8;
  UINT32 local_5b4;
  UByteArray fdm;
  UINT32 itemAltSize;
  UINT32 local_58c;
  CBString info_1;
  CBString name;
  CBString info;
  UByteArray data;
  UINT32 prevItemAltSize;
  UByteArray header;
  UByteArray local_4e0;
  UByteArray body;
  insyde_fdm_t parsed;
  CBString local_3d8;
  CBString name_1;
  CBString local_3a8;
  UModelIndex volumeIndex;
  EFI_GUID local_238;
  CBString local_228;
  CBString local_210;
  CBString text;
  UModelIndex headerIndex;
  UByteArray padding;
  
  bVar6 = UModelIndex::isValid(index);
  if (!bVar6) {
    return 1;
  }
  TreeModel::body(&data,this->model,index);
  TreeModel::header(&padding,this->model,index);
  local_5c8._M_t.
  super__Tuple_impl<0UL,_insyde_fdm_t::fdm_extensions_t_*,_std::default_delete<insyde_fdm_t::fdm_extensions_t>_>
  .super__Head_base<0UL,_insyde_fdm_t::fdm_extensions_t_*,_false>._M_head_impl._4_4_ = 0;
  local_5c8._M_t.
  super__Tuple_impl<0UL,_insyde_fdm_t::fdm_extensions_t_*,_std::default_delete<insyde_fdm_t::fdm_extensions_t>_>
  .super__Head_base<0UL,_insyde_fdm_t::fdm_extensions_t_*,_false>._M_head_impl._0_4_ =
       (uint)padding.d._M_string_length;
  std::__cxx11::string::~string((string *)&padding);
  Bstrlib::CBString::CBString(&name);
  Bstrlib::CBString::CBString(&info);
  prevItemType = '\0';
  local_5b4 = 0;
  local_58c = 0;
  prevItemAltSize = 0;
  UVar13 = findNextRawAreaItem(this,index,0,&prevItemType,&local_5b4,&local_58c,&prevItemAltSize);
  if (UVar13 == 0) {
    UVar7 = TreeModel::type(this->model,index);
    if ((UVar7 == '?') && (UVar7 = TreeModel::subtype(this->model,index), UVar7 == '\x01')) {
      UVar9 = TreeModel::base(this->model,index);
      uVar15 = (ulong)local_5b4;
      this->protectedRegionsBase = UVar9 + uVar15;
    }
    else {
      uVar15 = (ulong)local_5b4;
    }
    uVar14 = (uint)uVar15;
    local_620 = this;
    local_618 = index;
    if (uVar14 != 0) {
      UByteArray::left(&padding,&data,uVar14);
      Bstrlib::CBString::CBString((CBString *)&volumeIndex,"Padding");
      Bstrlib::CBString::operator=(&name,(CBString *)&volumeIndex);
      Bstrlib::CBString::~CBString((CBString *)&volumeIndex);
      usprintf((CBString *)&volumeIndex,"Full size: %Xh (%u)",
               (ulong)(uint)padding.d._M_string_length);
      Bstrlib::CBString::operator=(&info,(CBString *)&volumeIndex);
      Bstrlib::CBString::~CBString((CBString *)&volumeIndex);
      pTVar1 = local_620->model;
      UVar7 = getPaddingType(&padding);
      Bstrlib::CBString::CBString((CBString *)&paddingIndex);
      volumeIndex._0_8_ = &volumeIndex.m;
      volumeIndex.i = 0;
      volumeIndex.m = (TreeModel *)((ulong)volumeIndex.m & 0xffffffffffffff00);
      parsed.super_kstruct._vptr_kstruct = (_func_int **)&parsed.m_signature;
      parsed.super_kstruct.m__io = (kstream *)0x0;
      parsed.m_signature._0_1_ = 0;
      TreeModel::addItem((UModelIndex *)&fdm,pTVar1,
                         (UINT32)local_5c8._M_t.
                                 super__Tuple_impl<0UL,_insyde_fdm_t::fdm_extensions_t_*,_std::default_delete<insyde_fdm_t::fdm_extensions_t>_>
                                 .super__Head_base<0UL,_insyde_fdm_t::fdm_extensions_t_*,_false>.
                                 _M_head_impl,'@',UVar7,&name,(CBString *)&paddingIndex,&info,
                         (UByteArray *)&volumeIndex,&padding,(UByteArray *)&parsed,Fixed,local_618,
                         '\0');
      std::__cxx11::string::~string((string *)&parsed);
      std::__cxx11::string::~string((string *)&volumeIndex);
      Bstrlib::CBString::~CBString((CBString *)&paddingIndex);
      std::__cxx11::string::~string((string *)&padding);
    }
    itemType = prevItemType;
    local_608 = (ulong)local_58c;
    itemSize = local_58c;
    itemAltSize = prevItemAltSize;
    this_00 = &local_620->securityInfo;
    this_01 = &local_620->protectedRanges;
    UVar13 = 0;
    local_5b8 = uVar14;
    while( true ) {
      iVar17 = (int)uVar15;
      uVar14 = (uint)local_608;
      if (UVar13 != 0) break;
      local_610 = (ulong)local_5b8;
      uVar14 = uVar14 + iVar17;
      if (uVar14 <= local_5b8 && local_5b8 - uVar14 != 0) {
        UByteArray::mid(&padding,&data,uVar14,local_5b8 - uVar14);
        Bstrlib::CBString::CBString((CBString *)&volumeIndex,"Padding");
        Bstrlib::CBString::operator=(&name,(CBString *)&volumeIndex);
        Bstrlib::CBString::~CBString((CBString *)&volumeIndex);
        usprintf((CBString *)&volumeIndex,"Full size: %Xh (%u)",
                 (ulong)(uint)padding.d._M_string_length);
        Bstrlib::CBString::operator=(&info,(CBString *)&volumeIndex);
        Bstrlib::CBString::~CBString((CBString *)&volumeIndex);
        pTVar1 = local_620->model;
        UVar7 = getPaddingType(&padding);
        Bstrlib::CBString::CBString((CBString *)&paddingIndex);
        volumeIndex._0_8_ = &volumeIndex.m;
        volumeIndex.i = 0;
        volumeIndex.m = (TreeModel *)((ulong)volumeIndex.m & 0xffffffffffffff00);
        parsed.super_kstruct._vptr_kstruct = (_func_int **)&parsed.m_signature;
        parsed.super_kstruct.m__io = (kstream *)0x0;
        parsed.m_signature._0_1_ = 0;
        TreeModel::addItem((UModelIndex *)&fdm,pTVar1,
                           uVar14 + (uint)local_5c8._M_t.
                                          super__Tuple_impl<0UL,_insyde_fdm_t::fdm_extensions_t_*,_std::default_delete<insyde_fdm_t::fdm_extensions_t>_>
                                          .
                                          super__Head_base<0UL,_insyde_fdm_t::fdm_extensions_t_*,_false>
                                          ._M_head_impl,'@',UVar7,&name,(CBString *)&paddingIndex,
                           &info,(UByteArray *)&volumeIndex,&padding,(UByteArray *)&parsed,Fixed,
                           local_618,'\0');
        std::__cxx11::string::~string((string *)&parsed);
        std::__cxx11::string::~string((string *)&volumeIndex);
        Bstrlib::CBString::~CBString((CBString *)&paddingIndex);
        std::__cxx11::string::~string((string *)&padding);
      }
      uVar15 = (ulong)itemSize;
      pos = (int32_t)local_610;
      if (((uint)data.d._M_string_length < itemSize) ||
         (local_5fc = pos + itemSize, (uint)data.d._M_string_length < local_5fc)) {
        UByteArray::mid(&padding,&data,pos,-1);
        Bstrlib::CBString::CBString((CBString *)&volumeIndex,"Padding");
        Bstrlib::CBString::operator=(&name,(CBString *)&volumeIndex);
        Bstrlib::CBString::~CBString((CBString *)&volumeIndex);
        usprintf((CBString *)&volumeIndex,"Full size: %Xh (%u)",
                 (ulong)(uint)padding.d._M_string_length);
        Bstrlib::CBString::operator=(&info,(CBString *)&volumeIndex);
        Bstrlib::CBString::~CBString((CBString *)&volumeIndex);
        pTVar1 = local_620->model;
        UVar7 = getPaddingType(&padding);
        Bstrlib::CBString::CBString((CBString *)&fdm);
        volumeIndex._0_8_ = &volumeIndex.m;
        volumeIndex.i = 0;
        volumeIndex.m = (TreeModel *)((ulong)volumeIndex.m & 0xffffffffffffff00);
        parsed.super_kstruct._vptr_kstruct = (_func_int **)&parsed.m_signature;
        parsed.super_kstruct.m__io = (kstream *)0x0;
        parsed.m_signature._0_1_ = 0;
        TreeModel::addItem(&paddingIndex,pTVar1,
                           (int)local_610 +
                           (int)local_5c8._M_t.
                                super__Tuple_impl<0UL,_insyde_fdm_t::fdm_extensions_t_*,_std::default_delete<insyde_fdm_t::fdm_extensions_t>_>
                                .super__Head_base<0UL,_insyde_fdm_t::fdm_extensions_t_*,_false>.
                                _M_head_impl,'@',UVar7,&name,(CBString *)&fdm,&info,
                           (UByteArray *)&volumeIndex,&padding,(UByteArray *)&parsed,Fixed,local_618
                           ,'\0');
        std::__cxx11::string::~string((string *)&parsed);
        std::__cxx11::string::~string((string *)&volumeIndex);
        Bstrlib::CBString::~CBString((CBString *)&fdm);
        usprintf((CBString *)&volumeIndex,"%s: one of objects inside overlaps the end of data",
                 "parseRawArea");
        msg(local_620,(CBString *)&volumeIndex,&paddingIndex);
        Bstrlib::CBString::~CBString((CBString *)&volumeIndex);
        uVar14 = (uint)padding.d._M_string_length;
        std::__cxx11::string::~string((string *)&padding);
        iVar17 = (int)local_610;
        break;
      }
      local_608 = uVar15;
      if (itemType == '\\') {
        UByteArray::mid(&padding,&data,pos,itemSize);
        Bstrlib::CBString::CBString((CBString *)&volumeIndex,"BPDT region");
        Bstrlib::CBString::operator=(&name,(CBString *)&volumeIndex);
        Bstrlib::CBString::~CBString((CBString *)&volumeIndex);
        usprintf((CBString *)&volumeIndex,"Full size: %Xh (%u)",
                 (ulong)(uint)padding.d._M_string_length);
        Bstrlib::CBString::operator=(&info,(CBString *)&volumeIndex);
        Bstrlib::CBString::~CBString((CBString *)&volumeIndex);
        pTVar1 = local_620->model;
        Bstrlib::CBString::CBString((CBString *)&fdm);
        volumeIndex._0_8_ = &volumeIndex.m;
        volumeIndex.i = 0;
        volumeIndex.m = (TreeModel *)((ulong)volumeIndex.m & 0xffffffffffffff00);
        parsed.super_kstruct._vptr_kstruct = (_func_int **)&parsed.m_signature;
        parsed.super_kstruct.m__io = (kstream *)0x0;
        parsed.m_signature._0_1_ = 0;
        TreeModel::addItem(&paddingIndex,pTVar1,
                           (int)local_610 +
                           (int)local_5c8._M_t.
                                super__Tuple_impl<0UL,_insyde_fdm_t::fdm_extensions_t_*,_std::default_delete<insyde_fdm_t::fdm_extensions_t>_>
                                .super__Head_base<0UL,_insyde_fdm_t::fdm_extensions_t_*,_false>.
                                _M_head_impl,'\\','\0',&name,(CBString *)&fdm,&info,
                           (UByteArray *)&volumeIndex,&padding,(UByteArray *)&parsed,Fixed,local_618
                           ,'\0');
        std::__cxx11::string::~string((string *)&parsed);
        std::__cxx11::string::~string((string *)&volumeIndex);
        Bstrlib::CBString::~CBString((CBString *)&fdm);
        volumeIndex.r = -1;
        volumeIndex.c = -1;
        volumeIndex.i = 0;
        volumeIndex.m = (TreeModel *)0x0;
        UVar13 = parseBpdtRegion(local_620,&padding,0,0,&paddingIndex,&volumeIndex);
        if (UVar13 != 0) {
          usprintf((CBString *)&fdm,"%s: BPDT store parsing failed with error ","parseRawArea");
          errorCodeToUString((CBString *)&header,UVar13);
          Bstrlib::CBString::operator+((CBString *)&parsed,(CBString *)&fdm,(CBString *)&header);
          msg(local_620,(CBString *)&parsed,local_618);
          Bstrlib::CBString::~CBString((CBString *)&parsed);
          Bstrlib::CBString::~CBString((CBString *)&header);
          Bstrlib::CBString::~CBString((CBString *)&fdm);
        }
        std::__cxx11::string::~string((string *)&padding);
        prevItemType = '\\';
      }
      else if (itemType == 'L') {
        UByteArray::mid(&fdm,&data,pos,itemSize);
        umemstream::umemstream
                  ((umemstream *)&volumeIndex,fdm.d._M_dataplus._M_p,
                   (long)(int)(uint)fdm.d._M_string_length);
        kaitai::kstream::kstream((kstream *)&padding,(istream *)&volumeIndex);
        insyde_fdm_t::insyde_fdm_t(&parsed,(kstream *)&padding,(kstruct *)0x0,(insyde_fdm_t *)0x0);
        uVar14 = (uint)fdm.d._M_string_length;
        UByteArray::left(&header,&fdm,parsed.m_data_offset);
        UByteArray::mid(&body,&fdm,(uint)header.d._M_string_length,
                        uVar14 - (uint)header.d._M_string_length);
        Bstrlib::CBString::CBString(&name_1,"Insyde H2O FlashDeviceMap");
        usprintf(&info_1,
                 "Signature: HFDM\nFull size: %Xh (%u)\nHeader size: %Xh (%u)\nBody size: %Xh (%u)\nData offset: %Xh\nEntry size: %Xh (%u)\nEntry format: %02Xh\nRevision: %02Xh\nExtension count: %u\nFlash descriptor base address: %08Xh\nChecksum: %02Xh"
                 ,(ulong)uVar14,(ulong)uVar14,(ulong)(uint)header.d._M_string_length,
                 (ulong)(uint)header.d._M_string_length,(ulong)(uint)body.d._M_string_length,
                 (ulong)(uint)body.d._M_string_length,(ulong)parsed.m_data_offset,
                 (ulong)parsed.m_entry_size,(ulong)parsed.m_entry_size,(ulong)parsed.m_entry_format,
                 (ulong)parsed.m_revision,(ulong)parsed.m_num_extensions,
                 (ulong)(uint)parsed.m_fd_base_address,(ulong)parsed.m_checksum);
        UByteArray::mid((UByteArray *)&paddingIndex,&data,(int32_t)local_610,0x1c);
        buffer = (UINT8 *)UByteArray::data((UByteArray *)&paddingIndex);
        buffer[0x13] = '\0';
        bVar8 = calculateChecksum8(buffer,CONCAT13(paddingIndex.i._3_1_,
                                                   CONCAT12(paddingIndex.i._2_1_,
                                                            (undefined2)paddingIndex.i)));
        if (bVar8 == parsed.m_checksum) {
          Bstrlib::CBString::CBString((CBString *)&local_4e0,", valid");
          Bstrlib::CBString::operator+=(&info_1,(CBString *)&local_4e0);
        }
        else {
          usprintf((CBString *)&local_4e0,", invalid, should be %02Xh",(ulong)bVar8);
          Bstrlib::CBString::operator+=(&info_1,(CBString *)&local_4e0);
        }
        Bstrlib::CBString::~CBString((CBString *)&local_4e0);
        std::__cxx11::string::~string((string *)&paddingIndex);
        if (parsed.n_board_ids == false) {
          usprintf((CBString *)&paddingIndex,"\nRegion index: %Xh\nBoardId Count: %u",
                   (ulong)*(uint *)((long)parsed.m_board_ids._M_t.
                                          super___uniq_ptr_impl<insyde_fdm_t::fdm_board_ids_t,_std::default_delete<insyde_fdm_t::fdm_board_ids_t>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_insyde_fdm_t::fdm_board_ids_t_*,_std::default_delete<insyde_fdm_t::fdm_board_ids_t>_>
                                          .
                                          super__Head_base<0UL,_insyde_fdm_t::fdm_board_ids_t_*,_false>
                                          ._M_head_impl + 0x10),
                   (ulong)*(uint *)((long)parsed.m_board_ids._M_t.
                                          super___uniq_ptr_impl<insyde_fdm_t::fdm_board_ids_t,_std::default_delete<insyde_fdm_t::fdm_board_ids_t>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_insyde_fdm_t::fdm_board_ids_t_*,_std::default_delete<insyde_fdm_t::fdm_board_ids_t>_>
                                          .
                                          super__Head_base<0UL,_insyde_fdm_t::fdm_board_ids_t_*,_false>
                                          ._M_head_impl + 0x14));
          Bstrlib::CBString::operator+=(&info_1,(CBString *)&paddingIndex);
          Bstrlib::CBString::~CBString((CBString *)&paddingIndex);
          puVar3 = (undefined8 *)
                   (*(undefined8 **)
                     ((long)parsed.m_board_ids._M_t.
                            super___uniq_ptr_impl<insyde_fdm_t::fdm_board_ids_t,_std::default_delete<insyde_fdm_t::fdm_board_ids_t>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_insyde_fdm_t::fdm_board_ids_t_*,_std::default_delete<insyde_fdm_t::fdm_board_ids_t>_>
                            .super__Head_base<0UL,_insyde_fdm_t::fdm_board_ids_t_*,_false>.
                            _M_head_impl + 0x18))[1];
          uVar15 = 0;
          for (puVar19 = (undefined8 *)
                         **(undefined8 **)
                           ((long)parsed.m_board_ids._M_t.
                                  super___uniq_ptr_impl<insyde_fdm_t::fdm_board_ids_t,_std::default_delete<insyde_fdm_t::fdm_board_ids_t>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_insyde_fdm_t::fdm_board_ids_t_*,_std::default_delete<insyde_fdm_t::fdm_board_ids_t>_>
                                  .super__Head_base<0UL,_insyde_fdm_t::fdm_board_ids_t_*,_false>.
                                  _M_head_impl + 0x18); puVar19 != puVar3; puVar19 = puVar19 + 1) {
            usprintf((CBString *)&paddingIndex,"\nBoardId #%u: %lX\n",uVar15,*puVar19);
            Bstrlib::CBString::operator+=(&info_1,(CBString *)&paddingIndex);
            Bstrlib::CBString::~CBString((CBString *)&paddingIndex);
            uVar15 = (ulong)((int)uVar15 + 1);
          }
        }
        pTVar1 = local_620->model;
        Bstrlib::CBString::CBString((CBString *)&local_4e0);
        paddingIndex._0_8_ = &paddingIndex.m;
        paddingIndex.i._0_2_ = 0;
        paddingIndex.i._2_1_ = 0;
        paddingIndex.i._3_1_ = 0;
        paddingIndex.i._4_4_ = 0;
        paddingIndex.m = (TreeModel *)((ulong)paddingIndex.m & 0xffffffffffffff00);
        TreeModel::addItem(&headerIndex,pTVar1,
                           (int)local_610 +
                           (int)local_5c8._M_t.
                                super__Tuple_impl<0UL,_insyde_fdm_t::fdm_extensions_t_*,_std::default_delete<insyde_fdm_t::fdm_extensions_t>_>
                                .super__Head_base<0UL,_insyde_fdm_t::fdm_extensions_t_*,_false>.
                                _M_head_impl,'L','\0',&name_1,(CBString *)&local_4e0,&info_1,&header
                           ,&body,(UByteArray *)&paddingIndex,Fixed,local_618,'\0');
        std::__cxx11::string::~string((string *)&paddingIndex);
        Bstrlib::CBString::~CBString((CBString *)&local_4e0);
        plVar18 = (long *)**(undefined8 **)
                            ((long)parsed.m_entries._M_t.
                                   super___uniq_ptr_impl<insyde_fdm_t::fdm_entries_t,_std::default_delete<insyde_fdm_t::fdm_entries_t>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_insyde_fdm_t::fdm_entries_t_*,_std::default_delete<insyde_fdm_t::fdm_entries_t>_>
                                   .super__Head_base<0UL,_insyde_fdm_t::fdm_entries_t_*,_false>.
                                   _M_head_impl + 0x10);
        plVar2 = (long *)(*(undefined8 **)
                           ((long)parsed.m_entries._M_t.
                                  super___uniq_ptr_impl<insyde_fdm_t::fdm_entries_t,_std::default_delete<insyde_fdm_t::fdm_entries_t>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_insyde_fdm_t::fdm_entries_t_*,_std::default_delete<insyde_fdm_t::fdm_entries_t>_>
                                  .super__Head_base<0UL,_insyde_fdm_t::fdm_entries_t_*,_false>.
                                  _M_head_impl + 0x10))[1];
        local_5c0 = 0;
        UVar9 = parsed.m_data_offset;
        for (; plVar18 != plVar2; plVar18 = plVar18 + 1) {
          std::__cxx11::string::string((string *)&paddingIndex,(string *)(*plVar18 + 0x18));
          local_238._0_8_ = *(undefined8 *)paddingIndex._0_8_;
          local_238.Data4 = *(UINT8 (*) [8])(paddingIndex._0_8_ + 8);
          std::__cxx11::string::~string((string *)&paddingIndex);
          insydeFlashDeviceMapEntryTypeGuidToUString((CBString *)&paddingIndex,&local_238);
          Bstrlib::CBString::operator=(&name_1,(CBString *)&paddingIndex);
          Bstrlib::CBString::~CBString((CBString *)&paddingIndex);
          Bstrlib::CBString::CBString(&text);
          iVar17 = (int)local_610 + UVar9;
          UByteArray::mid((UByteArray *)&paddingIndex,&data,iVar17,0x34);
          std::__cxx11::string::_M_assign((string *)&header);
          std::__cxx11::string::~string((string *)&paddingIndex);
          UByteArray::mid((UByteArray *)&paddingIndex,&data,iVar17 + (uint)header.d._M_string_length
                          ,parsed.m_entry_size - (uint)header.d._M_string_length);
          std::__cxx11::string::_M_assign((string *)&body);
          std::__cxx11::string::~string((string *)&paddingIndex);
          uVar14 = (uint)body.d._M_string_length + (uint)header.d._M_string_length;
          Bstrlib::CBString::CBString(&local_3a8,"Region type: ");
          guidToUString(&local_3d8,&local_238,false);
          Bstrlib::CBString::operator+((CBString *)&local_4e0,&local_3a8,&local_3d8);
          Bstrlib::CBString::operator+((CBString *)&paddingIndex,(CBString *)&local_4e0,"\n");
          Bstrlib::CBString::operator=(&info_1,(CBString *)&paddingIndex);
          Bstrlib::CBString::~CBString((CBString *)&paddingIndex);
          Bstrlib::CBString::~CBString((CBString *)&local_4e0);
          Bstrlib::CBString::~CBString(&local_3d8);
          Bstrlib::CBString::~CBString(&local_3a8);
          Bstrlib::CBString::CBString((CBString *)&paddingIndex,"Region id: ");
          Bstrlib::CBString::operator+=(&info_1,(CBString *)&paddingIndex);
          Bstrlib::CBString::~CBString((CBString *)&paddingIndex);
          for (lVar16 = 0; uVar5 = (uint)header.d._M_string_length, lVar16 != 0x10;
              lVar16 = lVar16 + 1) {
            std::__cxx11::string::string((string *)&paddingIndex,(string *)(*plVar18 + 0x38));
            usprintf((CBString *)&local_4e0,"%02X",(ulong)*(byte *)(paddingIndex._0_8_ + lVar16));
            Bstrlib::CBString::operator+=(&info_1,(CBString *)&local_4e0);
            Bstrlib::CBString::~CBString((CBString *)&local_4e0);
            std::__cxx11::string::~string((string *)&paddingIndex);
          }
          uVar4 = CONCAT44(body.d._M_string_length._4_4_,(uint)body.d._M_string_length);
          uVar10 = insyde_fdm_t::fdm_entry_t::region_base((fdm_entry_t *)*plVar18);
          usprintf((CBString *)&paddingIndex,
                   "\nFull size: %Xh (%u)\nHeader size: %Xh (%u)\nBody size: %Xh (%u)\nRegion address: %08Xh\nRegion size: %08Xh\nAttributes: %08Xh"
                   ,(ulong)uVar14,(ulong)uVar14,uVar5,uVar5,uVar4,uVar4,(ulong)uVar10,
                   (ulong)*(uint *)(*plVar18 + 0x60),(ulong)*(uint *)(*plVar18 + 0x68));
          Bstrlib::CBString::operator+=(&info_1,(CBString *)&paddingIndex);
          Bstrlib::CBString::~CBString((CBString *)&paddingIndex);
          this_02 = &paddingIndex.m;
          if ((*(byte *)(*plVar18 + 0x68) & 1) == 0) {
            if ((local_5c0 & 1) == 0) {
              UVar11 = TreeModel::base(local_620->model,&headerIndex);
              usprintf((CBString *)&paddingIndex,
                       "Insyde Flash Device Map found at base %08Xh\nProtected ranges:\n",
                       (ulong)UVar11);
              Bstrlib::CBString::operator+=(this_00,(CBString *)&paddingIndex);
              Bstrlib::CBString::~CBString((CBString *)&paddingIndex);
              local_5c0 = (uint)CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
            }
            paddingIndex.i._0_2_ = 0;
            paddingIndex.i._2_1_ = 0;
            paddingIndex.r = 0;
            paddingIndex.c = 0;
            paddingIndex.m = (TreeModel *)&local_5d8;
            local_5d8._M_local_buf[0] = '\0';
            paddingIndex.r = insyde_fdm_t::fdm_entry_t::region_base((fdm_entry_t *)*plVar18);
            paddingIndex.c = *(int *)(*plVar18 + 0x60);
            paddingIndex.i._0_2_ = 0xb;
            paddingIndex.i._2_1_ = 9;
            std::__cxx11::string::_M_assign((string *)this_02);
            std::vector<PROTECTED_RANGE_,_std::allocator<PROTECTED_RANGE_>_>::push_back
                      (this_01,(value_type *)&paddingIndex);
            usprintf(&local_228,"Address: %08Xh Size: %Xh\nHash: ",(ulong)(uint)paddingIndex.r,
                     (ulong)(uint)paddingIndex.c);
            UByteArray::toHex(&local_4e0,&body);
            Bstrlib::CBString::CBString(&local_210,local_4e0.d._M_dataplus._M_p);
            Bstrlib::CBString::operator+(&local_3d8,&local_228,&local_210);
            Bstrlib::CBString::operator+(&local_3a8,&local_3d8,"\n");
            Bstrlib::CBString::operator+=(this_00,&local_3a8);
            Bstrlib::CBString::~CBString(&local_3a8);
            Bstrlib::CBString::~CBString(&local_3d8);
            Bstrlib::CBString::~CBString(&local_210);
            std::__cxx11::string::~string((string *)&local_4e0);
            Bstrlib::CBString::~CBString(&local_228);
            std::__cxx11::string::~string((string *)this_02);
          }
          paddingIndex.i._0_2_ = 0;
          paddingIndex.i._2_1_ = 0;
          paddingIndex.i._3_1_ = 0;
          paddingIndex.i._4_4_ = 0;
          paddingIndex.m = (TreeModel *)((ulong)paddingIndex.m & 0xffffffffffffff00);
          paddingIndex._0_8_ = this_02;
          TreeModel::addItem((UModelIndex *)&local_4e0,local_620->model,UVar9,'T','\0',&name_1,&text
                             ,&info_1,&header,&body,(UByteArray *)&paddingIndex,Fixed,&headerIndex,
                             '\0');
          std::__cxx11::string::~string((string *)&paddingIndex);
          UVar9 = uVar14 + UVar9;
          Bstrlib::CBString::~CBString(&text);
        }
        if ((local_5c0 & 1) != 0) {
          Bstrlib::CBString::operator+=(this_00,"\n");
        }
        Bstrlib::CBString::~CBString(&info_1);
        Bstrlib::CBString::~CBString(&name_1);
        std::__cxx11::string::~string((string *)&body);
        std::__cxx11::string::~string((string *)&header);
        insyde_fdm_t::~insyde_fdm_t(&parsed);
        std::__cxx11::istringstream::~istringstream((istringstream *)&padding.d._M_string_length);
        umemstream::~umemstream((umemstream *)&volumeIndex);
        std::__cxx11::string::~string((string *)&fdm);
        prevItemType = 'L';
      }
      else if (itemType == 'U') {
        volumeIndex.r = -1;
        volumeIndex.c = -1;
        volumeIndex.i = 0;
        volumeIndex.m = (TreeModel *)0x0;
        UByteArray::mid(&padding,&data,pos,itemSize);
        UVar13 = parseIntelMicrocodeHeader
                           (local_620,&padding,
                            pos + (int)local_5c8._M_t.
                                       super__Tuple_impl<0UL,_insyde_fdm_t::fdm_extensions_t_*,_std::default_delete<insyde_fdm_t::fdm_extensions_t>_>
                                       .
                                       super__Head_base<0UL,_insyde_fdm_t::fdm_extensions_t_*,_false>
                                       ._M_head_impl,local_618,&volumeIndex);
        if (UVar13 != 0) {
          usprintf((CBString *)&paddingIndex,"%s: microcode header parsing failed with error ",
                   "parseRawArea");
          errorCodeToUString((CBString *)&fdm,UVar13);
          Bstrlib::CBString::operator+
                    ((CBString *)&parsed,(CBString *)&paddingIndex,(CBString *)&fdm);
          msg(local_620,(CBString *)&parsed,local_618);
          Bstrlib::CBString::~CBString((CBString *)&parsed);
          Bstrlib::CBString::~CBString((CBString *)&fdm);
          Bstrlib::CBString::~CBString((CBString *)&paddingIndex);
        }
        std::__cxx11::string::~string((string *)&padding);
        prevItemType = 'U';
      }
      else {
        if (itemType != 'A') goto LAB_00124102;
        volumeIndex.r = -1;
        volumeIndex.c = -1;
        volumeIndex.i = 0;
        volumeIndex.m = (TreeModel *)0x0;
        UByteArray::mid(&padding,&data,pos,itemSize);
        UVar13 = parseVolumeHeader(local_620,&padding,
                                   pos + (int)local_5c8._M_t.
                                              super__Tuple_impl<0UL,_insyde_fdm_t::fdm_extensions_t_*,_std::default_delete<insyde_fdm_t::fdm_extensions_t>_>
                                              .
                                              super__Head_base<0UL,_insyde_fdm_t::fdm_extensions_t_*,_false>
                                              ._M_head_impl,local_618,&volumeIndex);
        if (UVar13 == 0) {
          if ((UINT32)local_608 != itemAltSize) {
            __return_storage_ptr__ = &parsed;
            usprintf((CBString *)__return_storage_ptr__,
                     "%s: volume size stored in header %Xh differs from calculated using block map %Xh"
                     ,"parseRawArea",local_608);
            msg(local_620,(CBString *)__return_storage_ptr__,&volumeIndex);
            goto LAB_00123a60;
          }
        }
        else {
          usprintf((CBString *)&paddingIndex,"%s: volume header parsing failed with error ",
                   "parseRawArea");
          errorCodeToUString((CBString *)&fdm,UVar13);
          Bstrlib::CBString::operator+
                    ((CBString *)&parsed,(CBString *)&paddingIndex,(CBString *)&fdm);
          msg(local_620,(CBString *)&parsed,local_618);
          Bstrlib::CBString::~CBString((CBString *)&parsed);
          Bstrlib::CBString::~CBString((CBString *)&fdm);
          __return_storage_ptr__ = (insyde_fdm_t *)&paddingIndex;
LAB_00123a60:
          Bstrlib::CBString::~CBString((CBString *)__return_storage_ptr__);
        }
        std::__cxx11::string::~string((string *)&padding);
        prevItemType = 'A';
      }
      uVar15 = local_610;
      local_5b4 = (UINT32)local_610;
      local_58c = (UINT32)local_608;
      UVar13 = findNextRawAreaItem(local_620,local_618,local_5fc,&itemType,&local_5b8,&itemSize,
                                   &itemAltSize);
    }
    uVar14 = uVar14 + iVar17;
    if (uVar14 < (uint)data.d._M_string_length) {
      UByteArray::mid(&padding,&data,uVar14,-1);
      Bstrlib::CBString::CBString((CBString *)&volumeIndex,"Padding");
      Bstrlib::CBString::operator=(&name,(CBString *)&volumeIndex);
      Bstrlib::CBString::~CBString((CBString *)&volumeIndex);
      usprintf((CBString *)&volumeIndex,"Full size: %Xh (%u)",
               (ulong)(uint)padding.d._M_string_length);
      Bstrlib::CBString::operator=(&info,(CBString *)&volumeIndex);
      Bstrlib::CBString::~CBString((CBString *)&volumeIndex);
      pTVar1 = local_620->model;
      UVar7 = getPaddingType(&padding);
      Bstrlib::CBString::CBString((CBString *)&paddingIndex);
      volumeIndex._0_8_ = &volumeIndex.m;
      volumeIndex.i = 0;
      volumeIndex.m = (TreeModel *)((ulong)volumeIndex.m & 0xffffffffffffff00);
      parsed.super_kstruct._vptr_kstruct = (_func_int **)&parsed.m_signature;
      parsed.super_kstruct.m__io = (kstream *)0x0;
      parsed.m_signature._0_1_ = 0;
      TreeModel::addItem((UModelIndex *)&fdm,pTVar1,
                         uVar14 + (uint)local_5c8._M_t.
                                        super__Tuple_impl<0UL,_insyde_fdm_t::fdm_extensions_t_*,_std::default_delete<insyde_fdm_t::fdm_extensions_t>_>
                                        .
                                        super__Head_base<0UL,_insyde_fdm_t::fdm_extensions_t_*,_false>
                                        ._M_head_impl,'@',UVar7,&name,(CBString *)&paddingIndex,
                         &info,(UByteArray *)&volumeIndex,&padding,(UByteArray *)&parsed,Fixed,
                         local_618,'\0');
      std::__cxx11::string::~string((string *)&parsed);
      std::__cxx11::string::~string((string *)&volumeIndex);
      Bstrlib::CBString::~CBString((CBString *)&paddingIndex);
      std::__cxx11::string::~string((string *)&padding);
    }
    UVar13 = 0;
    iVar17 = 0;
    while( true ) {
      iVar12 = TreeModel::rowCount(local_620->model,local_618);
      if (iVar12 <= iVar17) break;
      TreeModel::index((TreeModel *)&padding,(char *)local_618->m,iVar17);
      bVar8 = TreeModel::type(local_620->model,(UModelIndex *)&padding);
      uVar14 = bVar8 - 0x40;
      if (0x1e < uVar14) goto LAB_00124102;
      if ((0x50201001U >> (uVar14 & 0x1f) & 1) == 0) {
        if (uVar14 != 1) goto LAB_00124102;
        parseVolumeBody(local_620,(UModelIndex *)&padding);
      }
      iVar17 = iVar17 + 1;
    }
  }
  else {
    UVar13 = 0;
  }
LAB_0012299a:
  Bstrlib::CBString::~CBString(&info);
  Bstrlib::CBString::~CBString(&name);
  std::__cxx11::string::~string((string *)&data);
  return UVar13;
LAB_00124102:
  UVar13 = 9;
  goto LAB_0012299a;
}

Assistant:

USTATUS FfsParser::parseRawArea(const UModelIndex & index)
{
    // Sanity check
    if (!index.isValid())
        return U_INVALID_PARAMETER;
    
    // Get item data
    UByteArray data = model->body(index);
    UINT32 headerSize = (UINT32)model->header(index).size();
    
    USTATUS result;
    UString name;
    UString info;
    
    // Search for the first item
    UINT8  prevItemType = 0;
    UINT32 prevItemOffset = 0;
    UINT32 prevItemSize = 0;
    UINT32 prevItemAltSize = 0;
    
    result = findNextRawAreaItem(index, 0, prevItemType, prevItemOffset, prevItemSize, prevItemAltSize);
    if (result) {
        // No need to parse further
        return U_SUCCESS;
    }
    
    // Set base of protected regions to be the first volume
    if (model->type(index) == Types::Region
        && model->subtype(index) == Subtypes::BiosRegion) {
        protectedRegionsBase = (UINT64)model->base(index) + prevItemOffset;
    }
    
    // First item is not at the beginning of this raw area
    if (prevItemOffset > 0) {
        // Get info
        UByteArray padding = data.left(prevItemOffset);
        name = UString("Padding");
        info = usprintf("Full size: %Xh (%u)", (UINT32)padding.size(), (UINT32)padding.size());
        
        // Add tree item
        model->addItem(headerSize, Types::Padding, getPaddingType(padding), name, UString(), info, UByteArray(), padding, UByteArray(), Fixed, index);
    }
    
    // Search for and parse all items
    UINT8  itemType = prevItemType;
    UINT32 itemOffset = prevItemOffset;
    UINT32 itemSize = prevItemSize;
    UINT32 itemAltSize = prevItemAltSize;
    
    while (!result) {
        // Padding between items
        if (itemOffset > prevItemOffset + prevItemSize) {
            UINT32 paddingOffset = prevItemOffset + prevItemSize;
            UINT32 paddingSize = itemOffset - paddingOffset;
            UByteArray padding = data.mid(paddingOffset, paddingSize);
            
            // Get info
            name = UString("Padding");
            info = usprintf("Full size: %Xh (%u)", (UINT32)padding.size(), (UINT32)padding.size());
            
            // Add tree item
            model->addItem(headerSize + paddingOffset, Types::Padding, getPaddingType(padding), name, UString(), info, UByteArray(), padding, UByteArray(), Fixed, index);
        }
        
        // Check that item is fully present in input
        if (itemSize > (UINT32)data.size() || itemOffset + itemSize > (UINT32)data.size()) {
            // Mark the rest as padding and finish parsing
            UByteArray padding = data.mid(itemOffset);
            
            // Get info
            name = UString("Padding");
            info = usprintf("Full size: %Xh (%u)", (UINT32)padding.size(), (UINT32)padding.size());
            
            // Add tree item
            UModelIndex paddingIndex = model->addItem(headerSize + itemOffset, Types::Padding, getPaddingType(padding), name, UString(), info, UByteArray(), padding, UByteArray(), Fixed, index);
            msg(usprintf("%s: one of objects inside overlaps the end of data", __FUNCTION__), paddingIndex);
            
            // Update variables
            prevItemOffset = itemOffset;
            prevItemSize = (UINT32)padding.size();
            break;
        }
        
        // Parse current volume header
        if (itemType == Types::Volume) {
            UModelIndex volumeIndex;
            UByteArray volume = data.mid(itemOffset, itemSize);
            result = parseVolumeHeader(volume, headerSize + itemOffset, index, volumeIndex);
            if (result) {
                msg(usprintf("%s: volume header parsing failed with error ", __FUNCTION__) + errorCodeToUString(result), index);
            } else {
                // Show messages
                if (itemSize != itemAltSize)
                    msg(usprintf("%s: volume size stored in header %Xh differs from calculated using block map %Xh", __FUNCTION__,
                                 itemSize, itemAltSize),
                        volumeIndex);
            }
        }
        else if (itemType == Types::Microcode) {
            UModelIndex microcodeIndex;
            UByteArray microcode = data.mid(itemOffset, itemSize);
            result = parseIntelMicrocodeHeader(microcode, headerSize + itemOffset, index, microcodeIndex);
            if (result) {
                msg(usprintf("%s: microcode header parsing failed with error ", __FUNCTION__) + errorCodeToUString(result), index);
            }
        }
        else if (itemType == Types::BpdtStore) {
            UByteArray bpdtStore = data.mid(itemOffset, itemSize);
            
            // Get info
            name = UString("BPDT region");
            info = usprintf("Full size: %Xh (%u)", (UINT32)bpdtStore.size(), (UINT32)bpdtStore.size());
            
            // Add tree item
            UModelIndex bpdtIndex = model->addItem(headerSize + itemOffset, Types::BpdtStore, 0, name, UString(), info, UByteArray(), bpdtStore, UByteArray(), Fixed, index);
            
            // Parse BPDT region
            UModelIndex bpdtPtIndex;
            result = parseBpdtRegion(bpdtStore, 0, 0, bpdtIndex, bpdtPtIndex);
            if (result) {
                msg(usprintf("%s: BPDT store parsing failed with error ", __FUNCTION__) + errorCodeToUString(result), index);
            }
        }
        else if (itemType == Types::InsydeFlashDeviceMapStore) {
            try {
                UByteArray fdm = data.mid(itemOffset, itemSize);
                umemstream is(fdm.constData(), fdm.size());
                kaitai::kstream ks(&is);
                insyde_fdm_t parsed(&ks);
                UINT32 storeSize = (UINT32)fdm.size();
                
                // Construct header and body
                UByteArray header = fdm.left(parsed.data_offset());
                UByteArray body = fdm.mid(header.size(), storeSize - header.size());
                
                // Add info
                UString name = UString("Insyde H2O FlashDeviceMap");
                UString info = usprintf("Signature: HFDM\nFull size: %Xh (%u)\nHeader size: %Xh (%u)\nBody size: %Xh (%u)\nData offset: %Xh\nEntry size: %Xh (%u)\nEntry format: %02Xh\nRevision: %02Xh\nExtension count: %u\nFlash descriptor base address: %08Xh\nChecksum: %02Xh",
                                        storeSize, storeSize,
                                        (UINT32)header.size(), (UINT32)header.size(),
                                        (UINT32)body.size(), (UINT32)body.size(),
                                        parsed.data_offset(),
                                        parsed.entry_size(), parsed.entry_size(),
                                        parsed.entry_format(),
                                        parsed.revision(),
                                        parsed.num_extensions(),
                                        (UINT32)parsed.fd_base_address(),
                                        parsed.checksum());
                
                // Check header checksum
                {
                    UByteArray tempHeader = data.mid(itemOffset, sizeof(INSYDE_FLASH_DEVICE_MAP_HEADER));
                    INSYDE_FLASH_DEVICE_MAP_HEADER* tempFdmHeader = (INSYDE_FLASH_DEVICE_MAP_HEADER*)tempHeader.data();
                    tempFdmHeader->Checksum = 0;
                    UINT8 calculated = calculateChecksum8((const UINT8*)tempFdmHeader, (UINT32)tempHeader.size());
                    if (calculated == parsed.checksum()) {
                        info += UString(", valid");
                    }
                    else {
                        info += usprintf(", invalid, should be %02Xh", calculated);
                    }
                }
                
                // Add board IDs
                if (!parsed._is_null_board_ids()) {
                    info += usprintf("\nRegion index: %Xh\nBoardId Count: %u",
                                     parsed.board_ids()->region_index(),
                                     parsed.board_ids()->num_board_ids());
                    UINT32 i = 0;
                    for (const auto & boardId : *parsed.board_ids()->board_ids()) {
                        info += usprintf("\nBoardId #%u: %" PRIX64 "\n", i++, boardId);
                    }
                }
                
                // Add header tree item
                UModelIndex headerIndex = model->addItem(headerSize + itemOffset, Types::InsydeFlashDeviceMapStore, 0, name, UString(), info, header, body, UByteArray(), Fixed, index);
                
                // Add entries
                UINT32 entryOffset = parsed.data_offset();
                bool protectedRangeFound = false;
                for (const auto & entry : *parsed.entries()->entries()) {
                    const EFI_GUID guid = readUnaligned((const EFI_GUID*)entry->guid().c_str());
                    name = insydeFlashDeviceMapEntryTypeGuidToUString(guid);
                    UString text;
                    header = data.mid(itemOffset + entryOffset, sizeof(INSYDE_FLASH_DEVICE_MAP_ENTRY));
                    body = data.mid(itemOffset + entryOffset + header.size(), parsed.entry_size() - header.size());
                    
                    // Add info
                    UINT32 entrySize = (UINT32)header.size() + (UINT32)body.size();
                    info = UString("Region type: ") + guidToUString(guid, false) + "\n";
                    info += UString("Region id: ");
                    for (UINT8 i = 0; i < 16; i++) {
                        info += usprintf("%02X", *(const UINT8*)(entry->region_id().c_str() + i));
                    }
                    info += usprintf("\nFull size: %Xh (%u)\nHeader size: %Xh (%u)\nBody size: %Xh (%u)\nRegion address: %08Xh\nRegion size: %08Xh\nAttributes: %08Xh",
                                     entrySize, entrySize,
                                     (UINT32)header.size(), (UINT32)header.size(),
                                     (UINT32)body.size(), (UINT32)body.size(),
                                     (UINT32)entry->region_base(),
                                     (UINT32)entry->region_size(),
                                     entry->attributes());
                    
                    if ((entry->attributes() & INSYDE_FLASH_DEVICE_MAP_ENTRY_ATTRIBUTE_MODIFIABLE) == 0) {
                        if (!protectedRangeFound) {
                            securityInfo += usprintf("Insyde Flash Device Map found at base %08Xh\nProtected ranges:\n", model->base(headerIndex));
                            protectedRangeFound = true;
                        }
                        
                        // TODO: make sure that the only hash possible here is SHA256
                        
                        // Add this region to the list of Insyde protected regions
                        PROTECTED_RANGE range = {};
                        range.Offset = (UINT32)entry->region_base();
                        range.Size = (UINT32)entry->region_size();
                        range.AlgorithmId = TCG_HASH_ALGORITHM_ID_SHA256;
                        range.Type = PROTECTED_RANGE_VENDOR_HASH_INSYDE;
                        range.Hash = body;
                        protectedRanges.push_back(range);
                        
                        securityInfo += usprintf("Address: %08Xh Size: %Xh\nHash: ", range.Offset, range.Size) + UString(body.toHex().constData()) + "\n";
                    }
                    
                    // Add tree item
                    model->addItem(entryOffset, Types::InsydeFlashDeviceMapEntry, 0, name, text, info, header, body, UByteArray(), Fixed, headerIndex);
                    
                    entryOffset += entrySize;
                }
                
                if (protectedRangeFound) {
                    securityInfo += "\n";
                }
            }
            catch (...) {
                // Parsing failed
            }
        }
        else {
            return U_UNKNOWN_ITEM_TYPE;
        }
        
        // Go to next item
        prevItemOffset = itemOffset;
        prevItemSize = itemSize;
        prevItemType = itemType;
        result = findNextRawAreaItem(index, itemOffset + prevItemSize, itemType, itemOffset, itemSize, itemAltSize);
        
        // Silence value not used after assignment warning
        (void)prevItemType;
    }
    
    // Padding at the end of RAW area
    itemOffset = prevItemOffset + prevItemSize;
    if ((UINT32)data.size() > itemOffset) {
        UByteArray padding = data.mid(itemOffset);
        
        // Get info
        name = UString("Padding");
        info = usprintf("Full size: %Xh (%u)", (UINT32)padding.size(), (UINT32)padding.size());
        
        // Add tree item
        model->addItem(headerSize + itemOffset, Types::Padding, getPaddingType(padding), name, UString(), info, UByteArray(), padding, UByteArray(), Fixed, index);
    }
    
    // Parse bodies
    for (int i = 0; i < model->rowCount(index); i++) {
        UModelIndex current = index.model()->index(i, 0, index);
        
        switch (model->type(current)) {
            case Types::Volume:
                parseVolumeBody(current);
                break;
            case Types::Microcode:
                // Parsing already done
                break;
            case Types::BpdtStore:
                // Parsing already done
                break;
            case Types::BpdtPartition:
                // Parsing already done
                break;
            case Types::InsydeFlashDeviceMapStore:
                // Parsing already done
                break;
            case Types::Padding:
                // No parsing required
                break;
            default:
                return U_UNKNOWN_ITEM_TYPE;
        }
    }
    
    return U_SUCCESS;
}